

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O1

void __thiscall rudp::rudp_server::~rudp_server(rudp_server *this)

{
  _Manager_type p_Var1;
  
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::~_Rb_tree(&(this->session_bindings)._M_t);
  std::
  _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
  ::~_Rb_tree(&(this->sessions)._M_t);
  p_Var1 = (this->cb).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->cb,(_Any_data *)&this->cb,__destroy_functor);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&this->socket);
  return;
}

Assistant:

rudp_server( boost::asio::io_service &ios, uint16_t p, const std::function< void( rudp_server&, uint32_t, const buffers_ptr_t& ) > &cb_ ) : io_service( ios ), socket( ios, boost::asio::ip::udp::endpoint( boost::asio::ip::udp::v4(), p ) ), port( p ), cb( cb_ ) {
    receive();
  }